

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

Values * __thiscall dynamicgraph::command::Value::constValuesValue(Value *this)

{
  ExceptionAbstract *this_00;
  allocator<char> local_3d;
  int local_3c;
  string local_38;
  
  if (this->type_ == VALUES) {
    return (Values *)this->value_;
  }
  this_00 = (ExceptionAbstract *)__cxa_allocate_exception(0x30);
  local_3c = 700;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"value is not a vector of Value",&local_3d);
  ExceptionAbstract::ExceptionAbstract(this_00,&local_3c,&local_38);
  __cxa_throw(this_00,&ExceptionAbstract::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

const Values &Value::constValuesValue() const {
  if (type_ == VALUES) return *((const Values *)value_);
  throw ExceptionAbstract(ExceptionAbstract::TOOLS,
                          "value is not a vector of Value");
}